

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void std::__sort_heap<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (iterator __first,iterator __last,_Iter_less_iter *__comp)

{
  QGraphicsItem *pQVar1;
  QGraphicsItem **ppQVar2;
  long lVar3;
  
  lVar3 = (long)__last.i - (long)__first.i;
  if (8 < lVar3) {
    ppQVar2 = __last.i + -1;
    do {
      pQVar1 = *ppQVar2;
      *ppQVar2 = *__first.i;
      lVar3 = lVar3 + -8;
      __adjust_heap<QList<QGraphicsItem*>::iterator,long_long,QGraphicsItem*,__gnu_cxx::__ops::_Iter_less_iter>
                (__first.i,0,lVar3 >> 3,pQVar1);
      ppQVar2 = ppQVar2 + -1;
    } while (8 < lVar3);
  }
  return;
}

Assistant:

inline qsizetype operator-(iterator j) const { return i - j.i; }